

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O2

void __thiscall sznet::net::EventLoop::printActiveChannels(EventLoop *this)

{
  Channel *this_00;
  self *psVar1;
  pointer ppCVar2;
  pointer ppCVar3;
  SourceFile file;
  Logger local_1038;
  string local_68;
  undefined1 local_48 [12];
  pointer local_38;
  
  ppCVar2 = (this->m_activeChannels).
            super__Vector_base<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  local_38 = ppCVar2;
  for (ppCVar3 = (this->m_activeChannels).
                 super__Vector_base<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppCVar3 != ppCVar2; ppCVar3 = ppCVar3 + 1
      ) {
    if (g_logLevel < 1) {
      this_00 = *ppCVar3;
      Logger::SourceFile::SourceFile<100>
                ((SourceFile *)local_48,
                 (char (*) [100])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/EventLoop.cpp"
                );
      file._12_4_ = 0;
      file.m_data = (char *)local_48._0_8_;
      file.m_size = local_48._8_4_;
      Logger::Logger(&local_1038,file,0x149,TRACE,"printActiveChannels");
      psVar1 = LogStream::operator<<(&local_1038.m_impl.m_stream,"{");
      Channel::reventsToString_abi_cxx11_(&local_68,this_00);
      psVar1 = LogStream::operator<<(psVar1,&local_68);
      LogStream::operator<<(psVar1,"} ");
      std::__cxx11::string::~string((string *)&local_68);
      Logger::~Logger(&local_1038);
      ppCVar2 = local_38;
    }
  }
  return;
}

Assistant:

void EventLoop::printActiveChannels() const
{
	for (const Channel* channel : m_activeChannels)
	{
		LOG_TRACE << "{" << channel->reventsToString() << "} ";
	}
}